

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::SetDriftVelocity_NonUniform
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NESTcalc *this,double rho
          ,double zStep,double kel,double bar,double dx,double dy)

{
  bool bVar1;
  VDetector *this_00;
  NESTcalc *this_01;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  double eField;
  double local_80 [3];
  double local_68;
  double pos_z;
  double zz;
  double driftTime;
  double local_48;
  double dy_local;
  double dx_local;
  double bar_local;
  double kel_local;
  double zStep_local;
  double rho_local;
  NESTcalc *this_local;
  vector<double,_std::allocator<double>_> *speedTable;
  
  driftTime._7_1_ = 0;
  local_48 = dy;
  dy_local = dx;
  dx_local = bar;
  bar_local = kel;
  kel_local = zStep;
  zStep_local = rho;
  rho_local = (double)this;
  this_local = (NESTcalc *)__return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  for (local_68 = 0.0; dVar6 = local_68, dVar2 = VDetector::get_TopDrift(this->fdetector),
      dVar6 < dVar2; local_68 = kel_local + local_68) {
    zz = 0.0;
    for (pos_z = local_68; dVar2 = pos_z, dVar3 = VDetector::get_TopDrift(this->fdetector),
        dVar6 = local_68, dVar2 < dVar3; pos_z = kel_local + pos_z) {
      dVar4 = VDetector::get_gate(this->fdetector);
      dVar5 = zStep_local;
      dVar3 = kel_local;
      dVar2 = bar_local;
      if (dVar6 <= dVar4) {
        (*this->fdetector->_vptr_VDetector[4])(dy_local,local_48,pos_z);
        dVar6 = SetDriftVelocity(this,dVar2,dVar5,eField,dx_local);
        zz = dVar3 / dVar6 + zz;
      }
      else {
        bVar1 = VDetector::get_inGas(this->fdetector);
        dVar3 = zStep_local;
        dVar2 = kel_local;
        dVar6 = bar_local;
        if (bVar1) {
          this_01 = (NESTcalc *)this->fdetector;
          dVar5 = VDetector::get_E_gas((VDetector *)this_01);
          dVar6 = GetDriftVelocity_MagBoltz(this_01,dVar6,dVar3,dVar5 * 1000.0,dx_local,131.293);
          zz = dVar2 / dVar6 + zz;
        }
        else {
          this_00 = this->fdetector;
          dVar5 = VDetector::get_E_gas(this_00);
          std::abs((int)this_00);
          dVar6 = SetDriftVelocity(this,dVar6,dVar3,(dVar5 / (1.85 / extraout_XMM0_Qa)) * 1000.0,
                                   dx_local);
          zz = dVar2 / dVar6 + zz;
        }
      }
    }
    local_80[0] = (pos_z - local_68) / zz;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> NESTcalc::SetDriftVelocity_NonUniform(double rho, double zStep, double kel, double bar,
                                                     double dx, double dy) {
  vector<double> speedTable;
  double driftTime, zz;

  for (double pos_z = 0.0; pos_z < fdetector->get_TopDrift(); pos_z += zStep) {
    driftTime = 0.0;
    for (zz = pos_z; zz < fdetector->get_TopDrift(); zz += zStep) {
      if (pos_z > fdetector->get_gate()) {
        if (!fdetector->get_inGas())
          driftTime +=
              zStep / SetDriftVelocity(kel, rho,
                                       fdetector->get_E_gas() /
				       (EPS_LIQ / std::abs(EPS_GAS)) * 1e3, bar);
        else {
          // if gate == TopDrift properly set, shouldn't happen
          driftTime += zStep / GetDriftVelocity_MagBoltz(kel,
					   rho, fdetector->get_E_gas() * 1e3, bar);
        }
      } else {
        driftTime +=
            zStep /
            SetDriftVelocity(
                kel, rho,
                fdetector->FitEF(dx, dy,
                                 zz), bar);  // update x and y if you want 3-D fields
      }
    }

    speedTable.emplace_back((zz - pos_z) / driftTime);  // uses highest zz
  }

  return speedTable;
}